

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall
S2BooleanOperation::Impl::GetChainStarts
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          CrossingProcessor *cp,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *chain_starts)

{
  pointer *ppSVar1;
  S2BooleanOperation *pSVar2;
  S2ShapeIndex *pSVar3;
  S2ShapeIndex *index;
  iterator iVar4;
  ShapeEdgeId SVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  int extraout_var_00;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  S2ContainsPointQuery<S2ShapeIndex> query;
  ShapeEdge a;
  S2ContainsPointQuery<S2ShapeIndex> local_b0;
  ShapeEdgeId local_98;
  VType VStack_90;
  VType local_88;
  VType VStack_80;
  VType local_78;
  VType VStack_70;
  ShapeEdge local_68;
  S2Shape *pSVar11;
  
  pSVar2 = this->op_;
  pSVar3 = pSVar2->regions_[a_region_id];
  index = pSVar2->regions_[1 - a_region_id];
  if (pSVar2->result_empty_ != (bool *)0x0) {
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
  }
  bVar6 = HasInterior(index);
  if ((bVar6 || invert_b) || (this->op_->result_empty_ != (bool *)0x0)) {
    local_b0.options_.vertex_model_ = SEMI_OPEN;
    local_b0.index_ = index;
    (*index->_vptr_S2ShapeIndex[6])(&local_b0.it_,index,2);
    uVar8 = (*pSVar3->_vptr_S2ShapeIndex[2])();
    if ((int)uVar8 < 1) {
      bVar6 = true;
    }
    else {
      uVar12 = 0;
      do {
        iVar9 = (*pSVar3->_vptr_S2ShapeIndex[3])(pSVar3,(ulong)uVar12);
        pSVar11 = (S2Shape *)CONCAT44(extraout_var,iVar9);
        uVar13 = 4;
        if ((pSVar11 != (S2Shape *)0x0) &&
           ((invert_a == invert_result || (iVar9 = (*pSVar11->_vptr_S2Shape[4])(pSVar11), 1 < iVar9)
            ))) {
          if (this->op_->result_empty_ != (bool *)0x0) {
            cp->a_shape_ = pSVar11;
            iVar9 = (*pSVar11->_vptr_S2Shape[4])(pSVar11);
            cp->a_dimension_ = iVar9;
          }
          uVar10 = (*pSVar11->_vptr_S2Shape[6])(pSVar11);
          if (0 < (int)uVar10) {
            uVar14 = 0;
            do {
              iVar9 = (*pSVar11->_vptr_S2Shape[7])(pSVar11,uVar14);
              uVar13 = 7;
              if (extraout_var_00 != 0) {
                (*pSVar11->_vptr_S2Shape[8])(&local_98,pSVar11,uVar14,0);
                local_68.edge_.v0.c_[0] = (VType)CONCAT44(local_98.edge_id,local_98.shape_id);
                local_68.edge_.v1.c_[1] = local_78;
                local_68.edge_.v1.c_[2] = VStack_70;
                local_68.edge_.v0.c_[2] = local_88;
                local_68.edge_.v1.c_[0] = VStack_80;
                local_68.edge_.v0.c_[1] = VStack_90;
                local_68.id_.shape_id = uVar12;
                local_68.id_.edge_id = iVar9;
                if (bVar6) {
                  bVar7 = S2ContainsPointQuery<S2ShapeIndex>::Contains(&local_b0,&local_68.edge_.v0)
                  ;
                }
                else {
                  bVar7 = false;
                }
                if ((bool)(bVar7 ^ invert_b) == true) {
                  iVar4._M_current =
                       (chain_starts->
                       super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  local_98.shape_id = uVar12;
                  local_98.edge_id = iVar9;
                  if (iVar4._M_current ==
                      (chain_starts->
                      super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                    ::_M_realloc_insert<s2shapeutil::ShapeEdgeId>(chain_starts,iVar4,&local_98);
                  }
                  else {
                    SVar5.edge_id = iVar9;
                    SVar5.shape_id = uVar12;
                    *iVar4._M_current = SVar5;
                    ppSVar1 = &(chain_starts->
                               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppSVar1 = *ppSVar1 + 1;
                  }
                }
                if (this->op_->result_empty_ != (bool *)0x0) {
                  cp->chain_id_ = (int)uVar14;
                  cp->chain_start_ = iVar9;
                  cp->chain_limit_ = extraout_var_00 + iVar9;
                  cp->inside_ = (bool)(bVar7 ^ invert_b);
                  cp->v0_emitted_max_edge_id_ = iVar9 + -1;
                  cp->chain_v0_emitted_ = false;
                  bVar7 = ProcessIncidentEdges(this,&local_68,&local_b0,cp);
                  uVar13 = 1;
                  if (!bVar7) goto LAB_001a1783;
                }
                uVar13 = 0;
              }
LAB_001a1783:
              if ((uVar13 != 7) && (uVar13 != 0)) goto LAB_001a17a2;
              uVar13 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar13;
            } while (uVar10 != uVar13);
          }
          uVar13 = 5;
LAB_001a17a2:
          if (uVar13 == 5) {
            uVar13 = 0;
          }
        }
        if ((uVar13 & 3) != 0) goto LAB_001a17d7;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar8);
      uVar13 = 0;
LAB_001a17d7:
      bVar6 = (uVar13 & 5) == 0;
    }
    if (local_b0.it_.iter_._M_t.
        super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
        .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
        (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_b0.it_.iter_._M_t.
                            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl
                  + 8))();
    }
    if (!bVar6) {
      return false;
    }
  }
  iVar4._M_current =
       (chain_starts->
       super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (chain_starts->
      super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>::
    _M_realloc_insert<s2shapeutil::ShapeEdgeId_const&>
              ((vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>> *)
               chain_starts,iVar4,&kSentinel);
  }
  else {
    *iVar4._M_current = kSentinel;
    ppSVar1 = &(chain_starts->
               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::GetChainStarts(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    CrossingProcessor* cp, vector<ShapeEdgeId>* chain_starts) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];

  if (is_boolean_output()) {
    // If boolean output is requested, then we use the CrossingProcessor to
    // determine whether the first edge of each chain will be emitted to the
    // output region.  This lets us terminate the operation early in many
    // cases.
    cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);
  }

  // If region B has no two-dimensional shapes and is not inverted, then by
  // definition no chain starts are contained.  However if boolean output is
  // requested then we check for containment anyway, since as a side effect we
  // may discover that the result region is non-empty and terminate the entire
  // operation early.
  bool b_has_interior = HasInterior(b_index);
  if (b_has_interior || invert_b || is_boolean_output()) {
    auto query = MakeS2ContainsPointQuery(&b_index);
    int num_shape_ids = a_index.num_shape_ids();
    for (int shape_id = 0; shape_id < num_shape_ids; ++shape_id) {
      S2Shape* a_shape = a_index.shape(shape_id);
      if (a_shape == nullptr) continue;

      // If region A is being subtracted from region B, points and polylines
      // in region A can be ignored since these shapes never contribute to the
      // output (they can only remove edges from region B).
      if (invert_a != invert_result && a_shape->dimension() < 2) continue;

      if (is_boolean_output()) cp->StartShape(a_shape);
      int num_chains = a_shape->num_chains();
      for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
        S2Shape::Chain chain = a_shape->chain(chain_id);
        if (chain.length == 0) continue;
        ShapeEdge a(shape_id, chain.start, a_shape->chain_edge(chain_id, 0));
        bool inside = (b_has_interior && query.Contains(a.v0())) != invert_b;
        if (inside) {
          chain_starts->push_back(ShapeEdgeId(shape_id, chain.start));
        }
        if (is_boolean_output()) {
          cp->StartChain(chain_id, chain, inside);
          if (!ProcessIncidentEdges(a, &query, cp)) return false;
        }
      }
    }
  }
  chain_starts->push_back(kSentinel);
  return true;
}